

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O3

CSVGuessResult __thiscall
csv::internals::_guess_format
          (internals *this,string_view head,vector<char,_std::allocator<char>_> *delims)

{
  byte delim;
  byte *pbVar1;
  CSVFormat *pCVar2;
  ulong uVar3;
  CSVFormat *format_00;
  size_t sVar4;
  ulong uVar5;
  byte bVar6;
  CSVFormat *this_00;
  const_iterator __begin2;
  byte *pbVar7;
  bool bVar8;
  initializer_list<char> __l;
  string_view head_00;
  GuessScore GVar9;
  CSVFormat format;
  undefined1 local_92 [26];
  long local_78;
  void *local_70;
  undefined5 uStack_68;
  undefined3 uStack_63;
  undefined5 local_60;
  undefined3 uStack_5b;
  undefined5 uStack_58;
  undefined1 local_53;
  undefined1 local_50 [32];
  
  local_92._2_8_ = head._M_len;
  local_92[1] = 0x2c;
  format_00 = (CSVFormat *)local_92;
  __l._M_len = 1;
  __l._M_array = local_92 + 1;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)(local_92 + 10),__l,(allocator_type *)format_00)
  ;
  local_70 = (void *)0x0;
  uStack_68 = 0;
  uStack_63 = 0;
  local_60 = 0;
  uStack_5b = 0;
  uStack_58 = 0;
  local_53 = 0x22;
  local_50._0_8_ = (pointer)0x0;
  local_50._8_4_ = 0;
  local_50._12_4_ = 0;
  local_50._16_4_ = 0;
  local_50._20_8_ = 0;
  pbVar7 = *(byte **)head._M_str;
  pbVar1 = *(byte **)(head._M_str + 8);
  bVar6 = *pbVar7;
  if (pbVar7 == pbVar1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    sVar4 = 0;
    do {
      delim = *pbVar7;
      this_00 = (CSVFormat *)(local_92 + 10);
      pCVar2 = CSVFormat::delimiter(this_00,delim);
      head_00._M_str = (char *)pCVar2;
      head_00._M_len = local_92._2_8_;
      GVar9 = calculate_score((internals *)this_00,head_00,format_00);
      uVar3 = (ulong)GVar9.score;
      uVar3 = (long)(GVar9.score - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
      bVar8 = uVar5 < uVar3;
      format_00 = (CSVFormat *)(ulong)delim;
      if (bVar8) {
        bVar6 = delim;
      }
      if (uVar5 <= uVar3) {
        uVar5 = uVar3;
      }
      if (bVar8) {
        sVar4 = GVar9.header;
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar1);
    uVar5 = sVar4 << 0x20;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70,CONCAT35(uStack_5b,local_60) - (long)local_70);
  }
  if ((void *)local_92._10_8_ != (void *)0x0) {
    operator_delete((void *)local_92._10_8_,local_78 - local_92._10_8_);
  }
  return (CSVGuessResult)(uVar5 | bVar6);
}

Assistant:

CSV_INLINE CSVGuessResult _guess_format(csv::string_view head, const std::vector<char>& delims) {
            /** For each delimiter, find out which row length was most common.
             *  The delimiter with the longest mode row length wins.
             *  Then, the line number of the header row is the first row with
             *  the mode row length.
             */

            CSVFormat format;
            size_t max_score = 0,
                header = 0;
            char current_delim = delims[0];

            for (char cand_delim : delims) {
                auto result = calculate_score(head, format.delimiter(cand_delim));

                if ((size_t)result.score > max_score) {
                    max_score = (size_t)result.score;
                    current_delim = cand_delim;
                    header = result.header;
                }
            }

            return { current_delim, (int)header };
        }